

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.cpp
# Opt level: O3

void __thiscall
chrono::ChProximityContainerSPH::AddProximity
          (ChProximityContainerSPH *this,ChCollisionModel *modA,ChCollisionModel *modB)

{
  size_t *psVar1;
  AddProximityCallback *pAVar2;
  long lVar3;
  ChProximitySPH *this_00;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  bool bVar6;
  
  if (modA->mcontactable == (ChContactable *)0x0) {
    bVar6 = false;
  }
  else {
    lVar3 = __dynamic_cast(modA->mcontactable,&ChContactable::typeinfo,&ChNodeSPH::typeinfo,0x50);
    bVar6 = lVar3 != 0;
  }
  if (modB->mcontactable != (ChContactable *)0x0) {
    lVar3 = __dynamic_cast(modB->mcontactable,&ChContactable::typeinfo,&ChNodeSPH::typeinfo,0x50);
    if ((bool)(bVar6 & lVar3 != 0)) {
      pAVar2 = (this->super_ChProximityContainer).add_proximity_callback;
      if (pAVar2 != (AddProximityCallback *)0x0) {
        (**(code **)(*(long *)pAVar2 + 0x10))(pAVar2,modA,modB);
      }
      p_Var4 = (this->lastproximity)._M_node;
      p_Var5 = (_List_node_base *)&this->proximitylist;
      if (p_Var4 == p_Var5) {
        this_00 = (ChProximitySPH *)::operator_new(0x18);
        this_00->_vptr_ChProximitySPH = (_func_int **)&PTR__ChProximitySPH_00b10a00;
        ChProximitySPH::Reset(this_00,modA,modB);
        p_Var4 = (_List_node_base *)::operator_new(0x18);
        p_Var4[1]._M_next = (_List_node_base *)this_00;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(this->proximitylist).
                  super__List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        p_Var5 = p_Var4[1]._M_next;
        (*(code *)p_Var5->_M_next[1]._M_next)(p_Var5,modA,modB);
        p_Var5 = ((this->lastproximity)._M_node)->_M_next;
      }
      (this->lastproximity)._M_node = p_Var5;
      this->n_added = this->n_added + 1;
    }
  }
  return;
}

Assistant:

void ChProximityContainerSPH::AddProximity(collision::ChCollisionModel* modA, collision::ChCollisionModel* modB) {
    // Fetch the frames of that proximity and other infos

    ChNodeSPH* mnA = dynamic_cast<ChNodeSPH*>(modA->GetContactable());
    ChNodeSPH* mnB = dynamic_cast<ChNodeSPH*>(modB->GetContactable());

    if (!(mnA && mnB))
        return;

    // Launch the proximity callback, if implemented by the user

    if (this->add_proximity_callback) {
        this->add_proximity_callback->OnAddProximity(*modA, *modB);
    }

    // %%%%%%% Create and add a ChProximitySPH object

    if (lastproximity != proximitylist.end()) {
        // reuse old proximity pairs
        (*lastproximity)->Reset(modA, modB);

        lastproximity++;
    } else {
        // add new proximity
        ChProximitySPH* mp = new ChProximitySPH(modA, modB);

        proximitylist.push_back(mp);
        lastproximity = proximitylist.end();
    }
    n_added++;
}